

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageIO.cpp
# Opt level: O2

void tcu::ImageIO::loadImage(TextureLevel *dst,Archive *archive,char *fileName)

{
  bool bVar1;
  InternalError *this;
  string ext;
  FilePath local_40;
  
  de::FilePath::FilePath(&local_40,fileName);
  de::FilePath::getFileExtension_abi_cxx11_(&ext,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  bVar1 = std::operator==(&ext,"png");
  if (!bVar1) {
    bVar1 = std::operator==(&ext,"PNG");
    if (!bVar1) {
      this = (InternalError *)__cxa_allocate_exception(0x38);
      InternalError::InternalError
                (this,"Unrecognized image file extension",fileName,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageIO.cpp"
                 ,0x3e);
      __cxa_throw(this,&InternalError::typeinfo,Exception::~Exception);
    }
  }
  loadPNG(dst,archive,fileName);
  std::__cxx11::string::~string((string *)&ext);
  return;
}

Assistant:

void loadImage (TextureLevel& dst, const tcu::Archive& archive, const char* fileName)
{
	string ext = de::FilePath(fileName).getFileExtension();

	if (ext == "png" || ext == "PNG")
		loadPNG(dst, archive, fileName);
	else
		throw InternalError("Unrecognized image file extension", fileName, __FILE__, __LINE__);
}